

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderSetV2fAttribute(ImfHeader *hdr,char *name,float x,float y)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Vec2<float>_> *pTVar3;
  V2f v;
  Vec2<float> local_30;
  TypedAttribute<Imath_3_2::Vec2<float>_> local_28;
  
  local_30.x = x;
  local_30.y = y;
  IVar1 = Imf_3_2::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_2::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute(&local_28,&local_30);
    Imf_3_2::Header::insert((Header *)hdr,name,&local_28.super_Attribute);
    Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute(&local_28);
  }
  else {
    pTVar3 = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>>
                       ((Header *)hdr,name);
    (pTVar3->_value).x = x;
    (pTVar3->_value).y = y;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV2fAttribute (ImfHeader* hdr, const char name[], float x, float y)
{
    try
    {
        V2f v (x, y);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}